

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O0

int AF_FString_Replace(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  FString *this;
  FString *pFVar1;
  char *pcVar2;
  FString local_68;
  FString local_60 [3];
  FString local_48;
  FString s2;
  FString s1;
  FString *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                  ,0x352,
                  "int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                  ,0x352,
                  "int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (FString *)(param->field_0).field_1.a;
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                  ,0x353,
                  "int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type == '\x02') {
    pFVar1 = VMValue::s(param + 1);
    FString::FString(&s2,pFVar1);
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                    ,0x354,
                    "int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (param[2].field_0.field_3.Type == '\x02') {
      pFVar1 = VMValue::s(param + 2);
      FString::FString(&local_48,pFVar1);
      pcVar2 = FString::operator_cast_to_char_(&s2);
      FString::FString(local_60,*pcVar2);
      pcVar2 = FString::operator_cast_to_char_(&local_48);
      FString::FString(&local_68,*pcVar2);
      FString::Substitute(this,local_60,&local_68);
      FString::~FString(&local_68);
      FString::~FString(local_60);
      FString::~FString(&local_48);
      FString::~FString(&s2);
      return 0;
    }
    __assert_fail("param[paramnum].Type == REGT_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                  ,0x354,
                  "int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_STRING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                ,0x353,"int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(FString, Replace)
{
	PARAM_SELF_STRUCT_PROLOGUE(FString);
	PARAM_STRING(s1);
	PARAM_STRING(s2);
	self->Substitute(*s1, *s2);
	return 0;
}